

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

void rpn_CheckRST(Expression *expr,Expression *src)

{
  int32_t iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  bool bVar12;
  undefined2 uVar13;
  uint8_t *puVar14;
  uint uVar15;
  
  iVar1 = src->val;
  uVar2 = *(undefined4 *)&src->field_0x4;
  uVar3 = *(undefined4 *)&src->reason;
  uVar4 = *(undefined4 *)((long)&src->reason + 4);
  bVar12 = src->isSymbol;
  uVar13 = *(undefined2 *)&src->field_0x12;
  uVar5 = *(undefined4 *)&src->field_0x14;
  uVar6 = *(undefined4 *)&src->rpn;
  uVar7 = *(undefined4 *)((long)&src->rpn + 4);
  uVar8 = src->rpnCapacity;
  uVar9 = src->rpnLength;
  uVar10 = src->rpnPatchSize;
  uVar11 = *(undefined4 *)&src->field_0x2c;
  expr->isKnown = src->isKnown;
  expr->isSymbol = bVar12;
  *(undefined2 *)&expr->field_0x12 = uVar13;
  *(undefined4 *)&expr->field_0x14 = uVar5;
  *(undefined4 *)&expr->rpn = uVar6;
  *(undefined4 *)((long)&expr->rpn + 4) = uVar7;
  expr->rpnCapacity = uVar8;
  expr->rpnLength = uVar9;
  expr->rpnPatchSize = uVar10;
  *(undefined4 *)&expr->field_0x2c = uVar11;
  expr->val = iVar1;
  *(undefined4 *)&expr->field_0x4 = uVar2;
  *(undefined4 *)&expr->reason = uVar3;
  *(undefined4 *)((long)&expr->reason + 4) = uVar4;
  if (expr->isKnown == true) {
    uVar15 = expr->val;
    if ((uVar15 & 0xffffffc7) != 0) {
      error("Invalid address $%x for RST\n");
      uVar15 = expr->val;
    }
    expr->val = uVar15 | 199;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar14 = reserveSpace(expr,1);
    *puVar14 = 'a';
  }
  return;
}

Assistant:

void rpn_CheckRST(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;

	if (rpn_isKnown(expr)) {
		// A valid RST address must be masked with 0x38
		if (expr->val & ~0x38)
			error("Invalid address $%" PRIx32 " for RST\n", expr->val);
		// The target is in the "0x38" bits, all other bits are set
		expr->val |= 0xC7;
	} else {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_RST;
	}
}